

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.cpp
# Opt level: O0

void __thiscall pstore::exchange::export_ns::ostream::~ostream(ostream *this)

{
  ostream *this_local;
  
  ~ostream(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

ostream::~ostream () noexcept {
                PSTORE_TRY {
                    this->flush ();
                    // clang-format off
                }